

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O3

void __thiscall
cmCPackIFWResourcesParser::cmCPackIFWResourcesParser
          (cmCPackIFWResourcesParser *this,cmCPackIFWInstaller *i)

{
  pointer pcVar1;
  long *local_50 [2];
  long local_40 [2];
  
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser =
       (_func_int **)&PTR__cmCPackIFWResourcesParser_00699470;
  this->installer = i;
  this->file = false;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  (this->basePath)._M_dataplus._M_p = (pointer)&(this->basePath).field_2;
  (this->basePath)._M_string_length = 0;
  (this->basePath).field_2._M_local_buf[0] = '\0';
  pcVar1 = (i->Directory)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (i->Directory)._M_string_length);
  std::__cxx11::string::append((char *)local_50);
  std::__cxx11::string::operator=((string *)&this->path,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

cmCPackIFWResourcesParser(cmCPackIFWInstaller* i)
    : installer(i)
    , file(false)
  {
    this->path = i->Directory + "/resources";
  }